

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetCommandListAppendMarkerExpPrologue
          (ZETHandleLifetimeValidation *this,zet_command_list_handle_t hCommandList,
          zet_metric_group_handle_t hMetricGroup,uint32_t value)

{
  long lVar1;
  ze_result_t zVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  zet_command_list_handle_t local_28;
  
  lVar1 = context;
  local_28 = hCommandList;
  iVar3 = std::
          _Hashtable<_ze_command_list_handle_t_*,_std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_command_list_handle_t_*>,_std::hash<_ze_command_list_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<_ze_command_list_handle_t_*,_std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_command_list_handle_t_*>,_std::hash<_ze_command_list_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)(context + 0xd48) + 0x130),&local_28);
  if (iVar3.
      super__Node_iterator_base<std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else {
    local_28 = hCommandList;
    pmVar4 = std::__detail::
             _Map_base<_ze_command_list_handle_t_*,_std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_command_list_handle_t_*>,_std::hash<_ze_command_list_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<_ze_command_list_handle_t_*,_std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_command_list_handle_t_*>,_std::hash<_ze_command_list_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(*(long *)(lVar1 + 0xd48) + 0x130),&local_28);
    zVar2 = ZE_RESULT_ERROR_INVALID_ARGUMENT;
    if (((pmVar4->_M_t).
         super___uniq_ptr_impl<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>
         ._M_t.
         super__Tuple_impl<0UL,_validation_layer::_zel_handle_state_t_*,_std::default_delete<validation_layer::_zel_handle_state_t>_>
         .super__Head_base<0UL,_validation_layer::_zel_handle_state_t_*,_false>._M_head_impl)->
        is_open == true) {
      local_28 = (zet_command_list_handle_t)hMetricGroup;
      iVar5 = std::
              _Hashtable<_zet_metric_group_handle_t_*,_std::pair<_zet_metric_group_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_metric_group_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_metric_group_handle_t_*>,_std::hash<_zet_metric_group_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<_zet_metric_group_handle_t_*,_std::pair<_zet_metric_group_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_zet_metric_group_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_zet_metric_group_handle_t_*>,_std::hash<_zet_metric_group_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(*(long *)(lVar1 + 0xd48) + 0x600),(key_type *)&local_28);
      zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
      if (iVar5.
          super__Node_iterator_base<std::pair<_zet_metric_group_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        zVar2 = ZE_RESULT_SUCCESS;
      }
    }
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetCommandListAppendMarkerExpPrologue(
        zet_command_list_handle_t hCommandList,         ///< [in] handle to the command list
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle to the marker metric group.
                                                        ///< ::zet_metric_group_type_exp_flags_t could be used to check whether
                                                        ///< marker is supoported by the metric group.
        uint32_t value                                  ///< [in] marker value
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hCommandList )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if (!context.handleLifetime->isOpen( hCommandList )){
            return ZE_RESULT_ERROR_INVALID_ARGUMENT;
        }
        if ( !context.handleLifetime->isHandleValid( hMetricGroup )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }